

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O3

int gray_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  short *psVar1;
  FT_Bitmap *pFVar2;
  uint uVar3;
  int iVar4;
  gray_TWorker worker [1];
  gray_TWorker_ gStack_158;
  
  if (raster == (FT_Raster)0x0) {
    return 6;
  }
  if ((params->flags & 1U) == 0) {
    return 0x13;
  }
  psVar1 = (short *)params->source;
  if (psVar1 == (short *)0x0) {
    return 0x14;
  }
  if ((psVar1[1] != 0) && (0 < (long)*psVar1)) {
    if (*(long *)(psVar1 + 0xc) == 0) {
      return 0x14;
    }
    if (*(long *)(psVar1 + 4) == 0) {
      return 0x14;
    }
    if (*(short *)(*(long *)(psVar1 + 0xc) + -2 + (long)*psVar1 * 2) + 1 != (int)psVar1[1]) {
      return 0x14;
    }
    pFVar2 = params->target;
    gStack_158.outline._32_8_ = *(undefined8 *)(psVar1 + 0x10);
    gStack_158.outline.n_contours = psVar1[0];
    gStack_158.outline.n_points = psVar1[1];
    gStack_158.outline._4_2_ = psVar1[2];
    gStack_158.outline._6_2_ = psVar1[3];
    gStack_158.outline.points = *(FT_Vector **)(psVar1 + 4);
    gStack_158.outline.tags = *(char **)(psVar1 + 8);
    gStack_158.outline.contours = *(short **)(psVar1 + 0xc);
    if ((params->flags & 2U) == 0) {
      if (pFVar2 == (FT_Bitmap *)0x0) {
        return 6;
      }
      gStack_158.max_ex = pFVar2->width;
      if (gStack_158.max_ex == 0) {
        return 0;
      }
      gStack_158.max_ey = pFVar2->rows;
      if (gStack_158.max_ey == 0) {
        return 0;
      }
      if (pFVar2->buffer == (uchar *)0x0) {
        return 6;
      }
      gStack_158.target.pitch = pFVar2->pitch;
      uVar3 = (gStack_158.max_ey - 1U) * gStack_158.target.pitch;
      if (gStack_158.target.pitch < 0) {
        uVar3 = 0;
      }
      gStack_158.target.origin = pFVar2->buffer + uVar3;
      gStack_158.min_ex = 0;
      gStack_158.min_ey = 0;
      gStack_158.render_span = (FT_SpanFunc)0x0;
      gStack_158.render_span_data = (void *)0x0;
    }
    else {
      gStack_158.render_span = params->gray_spans;
      if (gStack_158.render_span == (FT_SpanFunc)0x0) {
        return 0;
      }
      gStack_158.render_span_data = params->user;
      gStack_158.min_ex = (TCoord)(params->clip_box).xMin;
      gStack_158.min_ey = (TCoord)(params->clip_box).yMin;
      gStack_158.max_ex = (TCoord)(params->clip_box).xMax;
      gStack_158.max_ey = (TCoord)(params->clip_box).yMax;
    }
    if (gStack_158.min_ex < gStack_158.max_ex) {
      if (gStack_158.min_ey < gStack_158.max_ey) {
        iVar4 = gray_convert_glyph(&gStack_158);
        return iVar4;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int
  gray_raster_render( FT_Raster                raster,
                      const FT_Raster_Params*  params )
  {
    const FT_Outline*  outline    = (const FT_Outline*)params->source;
    const FT_Bitmap*   target_map = params->target;

#ifndef FT_STATIC_RASTER
    gray_TWorker  worker[1];
#endif


    if ( !raster )
      return FT_THROW( Invalid_Argument );

    /* this version does not support monochrome rendering */
    if ( !( params->flags & FT_RASTER_FLAG_AA ) )
      return FT_THROW( Cannot_Render_Glyph );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return Smooth_Err_Ok;

    if ( !outline->contours || !outline->points )
      return FT_THROW( Invalid_Outline );

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return FT_THROW( Invalid_Outline );

    ras.outline = *outline;

    if ( params->flags & FT_RASTER_FLAG_DIRECT )
    {
      if ( !params->gray_spans )
        return Smooth_Err_Ok;

      ras.render_span      = (FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;

      ras.min_ex = params->clip_box.xMin;
      ras.min_ey = params->clip_box.yMin;
      ras.max_ex = params->clip_box.xMax;
      ras.max_ey = params->clip_box.yMax;
    }
    else
    {
      /* if direct mode is not set, we must have a target bitmap */
      if ( !target_map )
        return FT_THROW( Invalid_Argument );

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return Smooth_Err_Ok;

      if ( !target_map->buffer )
        return FT_THROW( Invalid_Argument );

      if ( target_map->pitch < 0 )
        ras.target.origin = target_map->buffer;
      else
        ras.target.origin = target_map->buffer
              + ( target_map->rows - 1 ) * (unsigned int)target_map->pitch;

      ras.target.pitch = target_map->pitch;

      ras.render_span      = (FT_Raster_Span_Func)NULL;
      ras.render_span_data = NULL;

      ras.min_ex = 0;
      ras.min_ey = 0;
      ras.max_ex = (FT_Pos)target_map->width;
      ras.max_ey = (FT_Pos)target_map->rows;
    }

    /* exit if nothing to do */
    if ( ras.max_ex <= ras.min_ex || ras.max_ey <= ras.min_ey )
      return Smooth_Err_Ok;

    return gray_convert_glyph( RAS_VAR );
  }